

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall
tinyusdz::crate::CrateReader::ReadIntArray<long>
          (CrateReader *this,bool is_compressed,vector<long,_std::allocator<long>_> *d)

{
  ulong uVar1;
  pointer plVar2;
  StreamReader *pSVar3;
  uint64_t uVar4;
  long *out;
  bool bVar5;
  ostream *poVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  size_t nbytes;
  size_t sVar10;
  uint32_t n;
  uint32_t shapesize;
  ostringstream ss_e;
  long *local_1d8;
  long local_1c8 [2];
  uint local_1b4;
  ulong local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if ((this->_version[0] == '\0') && (this->_version[1] < 7)) {
    bVar5 = StreamReader::read4(this->_sr,(uint32_t *)&local_1b0);
    if (bVar5) {
      bVar5 = StreamReader::read4(this->_sr,&local_1b4);
      if (bVar5) {
        local_1b0 = (ulong)local_1b4;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ReadIntArray",0xc);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x16b);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Failed to read the number of array elements.",0x2c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1d8);
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8,local_1c8[0] + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
        ::std::ios_base::~ios_base(local_138);
        local_1b0 = 0;
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadIntArray",0xc);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x166);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Failed to read the number of array elements.",0x2c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1d8);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
      ::std::ios_base::~ios_base(local_138);
      local_1b0 = 0;
      bVar5 = false;
    }
    if (bVar5 == false) {
      return false;
    }
  }
  else {
    bVar5 = StreamReader::read8(this->_sr,&local_1b0);
    if (!bVar5) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadIntArray",0xc);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x171);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Failed to read the number of array elements.",0x2c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1d8);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
      ::std::ios_base::~ios_base(local_138);
      local_1b0 = 0;
    }
    if (!bVar5) {
      return false;
    }
  }
  if (local_1b0 == 0) {
    plVar2 = (d->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    if ((d->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish != plVar2) {
      (d->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data._M_finish
           = plVar2;
      return true;
    }
    return true;
  }
  if ((this->_config).maxArrayElements < local_1b0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadIntArray",0xc);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x180);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    pcVar9 = "Too large array elements.";
    lVar8 = 0x19;
  }
  else {
    uVar1 = local_1b0 * 8;
    uVar7 = this->_memoryUsage + uVar1;
    this->_memoryUsage = uVar7;
    if ((this->_config).maxMemoryBudget < uVar7) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadIntArray",0xc);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x183);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      pcVar9 = "Reached to max memory budget.";
      lVar8 = 0x1d;
    }
    else {
      ::std::vector<long,_std::allocator<long>_>::resize
                ((vector<long,_std::allocator<long>_> *)d,local_1b0);
      if (is_compressed) {
        if (0xf < local_1b0) {
          out = (d->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
                ._M_start;
          bVar5 = ReadCompressedInts<long>
                            (this,out,(long)(d->super__Vector_base<long,_std::allocator<long>_>).
                                            _M_impl.super__Vector_impl_data._M_finish - (long)out >>
                                      3);
          return bVar5;
        }
        pSVar3 = this->_sr;
        uVar4 = pSVar3->idx_;
        sVar10 = pSVar3->length_ - uVar4;
        if (uVar4 + uVar1 <= pSVar3->length_) {
          sVar10 = uVar1;
        }
        bVar5 = sVar10 - 1 < uVar1;
        if (bVar5) {
          memcpy((d->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start,pSVar3->binary_ + uVar4,sVar10);
          pSVar3->idx_ = pSVar3->idx_ + sVar10;
        }
        bVar5 = bVar5 && sVar10 != 0;
        if (bVar5) {
          return bVar5;
        }
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ReadIntArray",0xc);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x197);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        pcVar9 = "Failed to read uncompressed integer array data.";
        lVar8 = 0x2f;
      }
      else {
        pSVar3 = this->_sr;
        uVar4 = pSVar3->idx_;
        sVar10 = pSVar3->length_ - uVar4;
        if (uVar4 + uVar1 <= pSVar3->length_) {
          sVar10 = uVar1;
        }
        if (sVar10 - 1 < uVar1) {
          memcpy((d->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start,pSVar3->binary_ + uVar4,sVar10);
          pSVar3->idx_ = pSVar3->idx_ + sVar10;
          if (sVar10 != 0) {
            return true;
          }
        }
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ReadIntArray",0xc);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x18c);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        pcVar9 = "Failed to read integer array data.";
        lVar8 = 0x22;
      }
    }
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,lVar8);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1d8);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool CrateReader::ReadIntArray(bool is_compressed, std::vector<T> *d) {

  size_t length{0}; // uncompressed array elements.
  // < ver 0.7.0  use 32bit
  if (VERSION_LESS_THAN_0_8_0(_version)) {
      uint32_t shapesize; // not used
      if (!_sr->read4(&shapesize)) {
        PUSH_ERROR("Failed to read the number of array elements.");
        return false;
      }
    uint32_t n;
    if (!_sr->read4(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
    }
    length = size_t(n);
  } else {
    uint64_t n;
    if (!_sr->read8(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
      return false;
    }

    DCOUT("array.len = " << n);
    length = size_t(n);
  }

  DCOUT("array.len = " << length);
  if (length == 0) {
    d->clear();
    return true;
  }

  if (length > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too large array elements.");
  }

  CHECK_MEMORY_USAGE(sizeof(T) * length);

  d->resize(length);

  if (!is_compressed) {

    // TODO(syoyo): Zero-copy
    if (!_sr->read(sizeof(T) * length, sizeof(T) * length,
                   reinterpret_cast<uint8_t *>(d->data()))) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read integer array data.");
    }

    return true;

  } else {

    if (length < crate::kMinCompressedArraySize) {
      size_t sz = sizeof(T) * length;
      // Not stored in compressed for smaller data
      if (!_sr->read(sz, sz, reinterpret_cast<uint8_t *>(d->data()))) {
        PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read uncompressed integer array data.");
      }
      return true;
    }

    return ReadCompressedInts(d->data(), d->size());
  }
}